

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::toString<float>(String *__return_storage_ptr__,IsNaN<float> in)

{
  char *in_00;
  String local_b8;
  String local_a0;
  String local_78;
  String local_60;
  String local_48;
  String local_30;
  IsNaN<float> local_18;
  IsNaN<float> in_local;
  
  in_00 = "";
  if (((ulong)in & 0x100000000) != 0) {
    in_00 = "! ";
  }
  local_18 = in;
  in_local = (IsNaN<float>)__return_storage_ptr__;
  String::String(&local_60,in_00);
  String::String(&local_78,"IsNaN( ");
  operator+(&local_48,&local_60,&local_78);
  toString(&local_a0,local_18.value);
  operator+(&local_30,&local_48,&local_a0);
  String::String(&local_b8," )");
  operator+(__return_storage_ptr__,&local_30,&local_b8);
  String::~String(&local_b8);
  String::~String(&local_30);
  String::~String(&local_a0);
  String::~String(&local_48);
  String::~String(&local_78);
  String::~String(&local_60);
  return __return_storage_ptr__;
}

Assistant:

String toString(IsNaN<F> in) { return String(in.flipped ? "! " : "") + "IsNaN( " + doctest::toString(in.value) + " )"; }